

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_dense.c
# Opt level: O1

int SUNLinSolSolve_Dense(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,realtype tol)

{
  sunindextype *p;
  sunindextype n;
  int iVar1;
  realtype **a;
  realtype *b_00;
  void *pvVar2;
  int iVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(S == (SUNLinearSolver)0x0);
  auVar4._4_4_ = -(uint)(A == (SUNMatrix)0x0);
  auVar4._8_4_ = -(uint)(x == (N_Vector)0x0);
  auVar4._12_4_ = -(uint)(b == (N_Vector)0x0);
  iVar3 = movmskps((int)x,auVar4);
  iVar1 = -0x321;
  if (iVar3 == 0) {
    N_VScale(1.0,b,x);
    a = SUNDenseMatrix_Cols(A);
    b_00 = N_VGetArrayPointer(x);
    pvVar2 = S->content;
    p = *(sunindextype **)((long)pvVar2 + 8);
    iVar1 = -0x323;
    if (p != (sunindextype *)0x0 && (b_00 != (realtype *)0x0 && a != (realtype **)0x0)) {
      n = SUNDenseMatrix_Rows(A);
      SUNDlsMat_denseGETRS(a,n,p,b_00);
      pvVar2 = S->content;
      iVar1 = 0;
    }
    *(int *)((long)pvVar2 + 0x10) = iVar1;
  }
  return iVar1;
}

Assistant:

int SUNLinSolSolve_Dense(SUNLinearSolver S, SUNMatrix A, N_Vector x,
                         N_Vector b, realtype tol)
{
  realtype **A_cols, *xdata;
  sunindextype *pivots;

  if ( (A == NULL) || (S == NULL) || (x == NULL) || (b == NULL) )
    return(SUNLS_MEM_NULL);

  /* copy b into x */
  N_VScale(ONE, b, x);

  /* access data pointers (return with failure on NULL) */
  A_cols = NULL;
  xdata = NULL;
  pivots = NULL;
  A_cols = SUNDenseMatrix_Cols(A);
  xdata = N_VGetArrayPointer(x);
  pivots = PIVOTS(S);
  if ( (A_cols == NULL) || (xdata == NULL)  || (pivots == NULL) ) {
    LASTFLAG(S) = SUNLS_MEM_FAIL;
    return(SUNLS_MEM_FAIL);
  }

  /* solve using LU factors */
  SUNDlsMat_denseGETRS(A_cols, SUNDenseMatrix_Rows(A), pivots, xdata);
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(SUNLS_SUCCESS);
}